

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O2

bool __thiscall ASDCP::MXF::UTF16String::Archive(UTF16String *this,MemIOWriter *Writer)

{
  pointer pcVar1;
  bool bVar2;
  ILogSink *pIVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  char *fmt;
  int iVar7;
  size_t __n;
  wchar_t wcp;
  mbstate_t ps;
  ui16_t local_44 [2];
  MemIOWriter *local_40;
  mbstate_t local_38;
  
  uVar5 = (this->super_string)._M_string_length;
  local_40 = Writer;
  if (uVar5 < 0x81) {
    pcVar1 = (this->super_string)._M_dataplus._M_p;
    local_38.__count = 0;
    local_38.__value = (_union_27)0x0;
    __n = uVar5 & 0xffffffff;
    for (uVar6 = 0; bVar2 = true, uVar6 < (uint)uVar5; uVar6 = uVar6 + iVar7) {
      sVar4 = mbrtowc((wchar_t *)local_44,pcVar1 + uVar6,__n,&local_38);
      iVar7 = (int)sVar4;
      if (iVar7 == 0) {
        return true;
      }
      if (iVar7 == -1) {
        pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
        fmt = "Error decoding multi-byte sequence starting at offset %u\n";
        uVar5 = (ulong)uVar6;
        goto LAB_00193bc2;
      }
      bVar2 = Kumu::MemIOWriter::WriteUi16BE(local_40,local_44[0]);
      if (!bVar2) {
        pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Error(pIVar3,"No more space in memory IO writer\n");
        return false;
      }
      __n = (size_t)(uint)((int)__n - iVar7);
    }
  }
  else {
    pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
    fmt = "String length exceeds maximum %u bytes\n";
    uVar5 = 0x80;
LAB_00193bc2:
    bVar2 = false;
    Kumu::ILogSink::Error(pIVar3,fmt,uVar5);
  }
  return bVar2;
}

Assistant:

bool
ASDCP::MXF::UTF16String::Archive(Kumu::MemIOWriter* Writer) const
{
  if ( size() > IdentBufferLen )
    {
      DefaultLogSink().Error("String length exceeds maximum %u bytes\n", IdentBufferLen);
      return false;
    }

  const char* mbp = c_str();
  wchar_t wcp;
  ui32_t remainder = size();
  ui32_t length = size();
  ui32_t i = 0;

  mbstate_t ps;
  memset(&ps, 0, sizeof(mbstate_t));

  while ( i < length )
    {
      int count = mbrtowc(&wcp, mbp+i, remainder, &ps);

      if ( count == -1 )
	{
	  DefaultLogSink().Error("Error decoding multi-byte sequence starting at offset %u\n", i);
	  return false;
	}
      else if ( count  == 0 )
	{
	  break;
	}

      bool result = Writer->WriteUi16BE((ui16_t)wcp);

      if ( result == false )
	{
	  DefaultLogSink().Error("No more space in memory IO writer\n");
	  return false;
	}

      i += count;
      remainder -= count;
    }

  return true;
}